

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::setLoggingCallback
          (CommonCore *this,LocalFederateId federateID,
          function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          *logFunction)

{
  _Manager_type p_Var1;
  uint16_t uVar2;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  string_view message;
  _Any_data local_f8;
  _Manager_type local_e8;
  _Invoker_type local_e0;
  ActionMessage loggerUpdate;
  
  if (federateID.fid == -0x103) {
    ActionMessage::ActionMessage(&loggerUpdate,cmd_core_configure);
    loggerUpdate.messageID = 0x250;
    loggerUpdate.source_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
    loggerUpdate.dest_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
    if ((logFunction->super__Function_base)._M_manager == (_Manager_type)0x0) {
      loggerUpdate.flags._1_1_ = loggerUpdate.flags._1_1_ | 0x80;
    }
    else {
      uVar2 = getNextAirlockIndex(this);
      gmlc::containers::AirLock<std::any,std::mutex,std::condition_variable>::
      load<std::function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>>
                ((AirLock<std::any,std::mutex,std::condition_variable> *)
                 ((this->dataAirlocks)._M_elems + uVar2),logFunction);
      loggerUpdate.counter = uVar2;
    }
    gmlc::containers::
    BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
    push<helics::ActionMessage&>
              ((BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
               &(this->super_BrokerBase).actionQueue,&loggerUpdate);
    ActionMessage::~ActionMessage(&loggerUpdate);
  }
  else {
    this_00 = getFederateAt(this,federateID);
    if (this_00 == (FederateState *)0x0) {
      this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
      message._M_str = "FederateID is not valid (setLoggingCallback)";
      message._M_len = 0x2c;
      InvalidIdentifier::InvalidIdentifier(this_01,message);
      __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
    }
    local_f8._M_unused._M_object = (void *)0x0;
    local_f8._8_8_ = 0;
    local_e8 = (_Manager_type)0x0;
    local_e0 = logFunction->_M_invoker;
    p_Var1 = (logFunction->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_f8._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(logFunction->super__Function_base)._M_functor;
      local_f8._8_8_ = *(undefined8 *)((long)&(logFunction->super__Function_base)._M_functor + 8);
      (logFunction->super__Function_base)._M_manager = (_Manager_type)0x0;
      logFunction->_M_invoker = (_Invoker_type)0x0;
      local_e8 = p_Var1;
    }
    FederateState::setLogger
              (this_00,(function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)&local_f8);
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  }
  return;
}

Assistant:

void CommonCore::setLoggingCallback(
    LocalFederateId federateID,
    std::function<void(int, std::string_view, std::string_view)> logFunction)
{
    if (federateID == gLocalCoreId) {
        ActionMessage loggerUpdate(CMD_CORE_CONFIGURE);
        loggerUpdate.messageID = UPDATE_LOGGING_CALLBACK;
        loggerUpdate.source_id = global_id.load();
        loggerUpdate.dest_id = global_id.load();
        if (logFunction) {
            auto index = getNextAirlockIndex();
            dataAirlocks[index].load(std::move(logFunction));
            loggerUpdate.counter = index;
        } else {
            setActionFlag(loggerUpdate, empty_flag);
        }

        actionQueue.push(loggerUpdate);
    } else {
        auto* fed = getFederateAt(federateID);
        if (fed == nullptr) {
            throw(InvalidIdentifier("FederateID is not valid (setLoggingCallback)"));
        }
        fed->setLogger(std::move(logFunction));
    }
}